

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_nls.c
# Opt level: O1

int CVodeSetNlsRhsFn(void *cvode_mem,CVRhsFn f)

{
  int iVar1;
  
  if (cvode_mem == (void *)0x0) {
    iVar1 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,0x9f,"CVodeSetNlsRhsFn",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_nls.c"
                   ,"cvode_mem = NULL illegal.");
  }
  else {
    if (f == (CVRhsFn)0x0) {
      *(undefined8 *)((long)cvode_mem + 0x3e0) = *(undefined8 *)((long)cvode_mem + 0x10);
    }
    else {
      *(CVRhsFn *)((long)cvode_mem + 0x3e0) = f;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeSetNlsRhsFn(void* cvode_mem, CVRhsFn f)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  if (f) { cv_mem->nls_f = f; }
  else { cv_mem->nls_f = cv_mem->cv_f; }

  return (CV_SUCCESS);
}